

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f wi)

{
  Point3f *pPVar1;
  float *s;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar9;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  BilinearPatchMesh *mesh;
  int *piVar19;
  Point3f *pPVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  bool bVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar44 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar51 [16];
  undefined1 auVar45 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  Float FVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  Point3f PVar86;
  Vector3f a;
  Vector3f a_00;
  Vector3f b;
  Vector3f b_00;
  Vector3f c;
  Vector3f c_00;
  Vector3f d;
  Vector3f d_00;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  Tuple3<pbrt::Vector3,_float> local_208;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  undefined4 uStack_1d4;
  undefined8 uStack_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  Tuple3<pbrt::Point3,_float> local_1a8;
  Tuple3<pbrt::Vector3,_float> local_198;
  Tuple3<pbrt::Vector3,_float> local_188;
  Tuple3<pbrt::Point3,_float> local_178;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_168;
  char local_68;
  Ray local_58;
  undefined1 auVar46 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 extraout_var [56];
  
  local_208.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar55._8_56_ = wi._8_56_;
  auVar55._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_208._0_8_ = vmovlps_avx(auVar55._0_16_);
  PVar86 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_208);
  local_58.o.super_Tuple3<pbrt::Point3,_float>.z = PVar86.super_Tuple3<pbrt::Point3,_float>.z;
  auVar56._0_8_ = PVar86.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar56._8_56_ = auVar55._8_56_;
  local_58.time = ctx->time;
  local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar56._0_16_);
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = local_208.x;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.y = local_208.y;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = local_208.z;
  local_58.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  Intersect((optional<pbrt::ShapeIntersection> *)&local_168.__align,this,&local_58,INFINITY);
  FVar52 = 0.0;
  if (local_68 == '\x01') {
    fVar53 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
    ;
    auVar35._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar35._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar35._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar35._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    fVar75 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high;
    auVar35 = vinsertps_avx(auVar35,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                            ,0x10);
    mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
    lVar30 = (long)this->blpIndex;
    piVar19 = mesh->vertexIndices;
    pPVar20 = mesh->p;
    lVar31 = (long)piVar19[lVar30 * 4];
    local_1c0 = lVar31 * 3;
    lVar32 = (long)piVar19[lVar30 * 4 + 1];
    fVar58 = pPVar20[lVar31].super_Tuple3<pbrt::Point3,_float>.z;
    local_1c8 = lVar32 * 3;
    iVar17 = piVar19[lVar30 * 4 + 2];
    iVar18 = piVar19[lVar30 * 4 + 3];
    uVar4 = pPVar20[iVar18].super_Tuple3<pbrt::Point3,_float>.x;
    uVar10 = pPVar20[iVar18].super_Tuple3<pbrt::Point3,_float>.y;
    local_1f8._0_4_ = pPVar20[lVar32].super_Tuple3<pbrt::Point3,_float>.z;
    fVar3 = pPVar20[iVar17].super_Tuple3<pbrt::Point3,_float>.z;
    uStack_1d0 = 0;
    uVar5 = pPVar20[lVar32].super_Tuple3<pbrt::Point3,_float>.x;
    uVar11 = pPVar20[lVar32].super_Tuple3<pbrt::Point3,_float>.y;
    local_238._4_4_ = uVar11;
    local_238._0_4_ = uVar5;
    local_238._8_8_ = 0;
    local_1e8._0_4_ = pPVar20[iVar18].super_Tuple3<pbrt::Point3,_float>.z;
    uVar9 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    auVar41._0_4_ = (float)uVar9 + auVar35._0_4_;
    auVar41._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar35._4_4_;
    auVar41._8_4_ = auVar35._8_4_ + 0.0;
    auVar41._12_4_ = auVar35._12_4_ + 0.0;
    local_1b8._0_4_ = pPVar20[lVar31].super_Tuple3<pbrt::Point3,_float>.x;
    local_1b8._4_4_ = pPVar20[lVar31].super_Tuple3<pbrt::Point3,_float>.y;
    auVar42._8_4_ = 0x3f000000;
    auVar42._0_8_ = 0x3f0000003f000000;
    auVar42._12_4_ = 0x3f000000;
    auVar35 = vmulps_avx512vl(auVar41,auVar42);
    uStack_1b0 = 0;
    uVar6 = pPVar20[iVar17].super_Tuple3<pbrt::Point3,_float>.x;
    uVar12 = pPVar20[iVar17].super_Tuple3<pbrt::Point3,_float>.y;
    local_228._4_4_ = uVar12;
    local_228._0_4_ = uVar6;
    local_228._8_8_ = 0;
    local_1d8 = (float)uVar4;
    uStack_1d4 = uVar10;
    bVar29 = IsRectangle(this,mesh);
    if ((bVar29) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
      fVar53 = (fVar53 + fVar75) * 0.5;
      fVar58 = fVar58 - fVar53;
      fVar75 = (float)local_1f8._0_4_ - fVar53;
      fVar3 = fVar3 - fVar53;
      fVar53 = (float)local_1e8._0_4_ - fVar53;
      auVar43._8_8_ = uStack_1b0;
      auVar43._0_8_ = local_1b8;
      auVar41 = vsubps_avx(auVar43,auVar35);
      auVar64._4_4_ = uStack_1d4;
      auVar64._0_4_ = local_1d8;
      auVar64._8_8_ = uStack_1d0;
      auVar51._0_4_ = auVar41._0_4_ * auVar41._0_4_;
      auVar51._4_4_ = auVar41._4_4_ * auVar41._4_4_;
      auVar51._8_4_ = auVar41._8_4_ * auVar41._8_4_;
      auVar51._12_4_ = auVar41._12_4_ * auVar41._12_4_;
      auVar42 = vhaddps_avx(auVar51,auVar51);
      auVar64 = vsubps_avx(auVar64,auVar35);
      auVar42 = ZEXT416((uint)(auVar42._0_4_ + fVar58 * fVar58));
      auVar42 = vsqrtss_avx(auVar42,auVar42);
      fVar34 = auVar42._0_4_;
      auVar78._4_4_ = fVar34;
      auVar78._0_4_ = fVar34;
      auVar78._8_4_ = fVar34;
      auVar78._12_4_ = fVar34;
      a.super_Tuple3<pbrt::Vector3,_float>.z = fVar58 / fVar34;
      auVar42 = vdivps_avx(auVar41,auVar78);
      auVar43 = vsubps_avx(local_238,auVar35);
      auVar62._0_4_ = auVar43._0_4_ * auVar43._0_4_;
      auVar62._4_4_ = auVar43._4_4_ * auVar43._4_4_;
      auVar62._8_4_ = auVar43._8_4_ * auVar43._8_4_;
      auVar62._12_4_ = auVar43._12_4_ * auVar43._12_4_;
      auVar41 = vhaddps_avx(auVar62,auVar62);
      auVar41 = ZEXT416((uint)(auVar41._0_4_ + fVar75 * fVar75));
      auVar41 = vsqrtss_avx(auVar41,auVar41);
      fVar58 = auVar41._0_4_;
      auVar37._4_4_ = fVar58;
      auVar37._0_4_ = fVar58;
      auVar37._8_4_ = fVar58;
      auVar37._12_4_ = fVar58;
      b.super_Tuple3<pbrt::Vector3,_float>.z = fVar75 / fVar58;
      auVar41 = vdivps_avx(auVar43,auVar37);
      auVar43 = vsubps_avx(local_228,auVar35);
      auVar40._0_4_ = auVar43._0_4_ * auVar43._0_4_;
      auVar40._4_4_ = auVar43._4_4_ * auVar43._4_4_;
      auVar40._8_4_ = auVar43._8_4_ * auVar43._8_4_;
      auVar40._12_4_ = auVar43._12_4_ * auVar43._12_4_;
      auVar35 = vhaddps_avx(auVar40,auVar40);
      auVar35 = ZEXT416((uint)(auVar35._0_4_ + fVar3 * fVar3));
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar75 = auVar35._0_4_;
      auVar39._4_4_ = fVar75;
      auVar39._0_4_ = fVar75;
      auVar39._8_4_ = fVar75;
      auVar39._12_4_ = fVar75;
      d.super_Tuple3<pbrt::Vector3,_float>.z = fVar3 / fVar75;
      local_1e8 = vdivps_avx(auVar43,auVar39);
      auVar38._0_4_ = auVar64._0_4_ * auVar64._0_4_;
      auVar38._4_4_ = auVar64._4_4_ * auVar64._4_4_;
      auVar38._8_4_ = auVar64._8_4_ * auVar64._8_4_;
      auVar38._12_4_ = auVar64._12_4_ * auVar64._12_4_;
      auVar35 = vhaddps_avx(auVar38,auVar38);
      auVar35 = ZEXT416((uint)(fVar53 * fVar53 + auVar35._0_4_));
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar75 = auVar35._0_4_;
      auVar36._4_4_ = fVar75;
      auVar36._0_4_ = fVar75;
      auVar36._8_4_ = fVar75;
      auVar36._12_4_ = fVar75;
      c.super_Tuple3<pbrt::Vector3,_float>.z = fVar53 / fVar75;
      local_1f8 = vdivps_avx(auVar64,auVar36);
      a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar42._0_8_;
      b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar41._0_8_;
      c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_1f8._0_8_;
      d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_1e8._0_8_;
      local_1d8 = b.super_Tuple3<pbrt::Vector3,_float>.z;
      FVar52 = SphericalQuadArea(a,b,c,d);
      auVar42 = local_1e8;
      auVar35 = local_1f8;
      bVar29 = NAN(FVar52);
      bVar33 = FVar52 == 0.0001;
      if (0.0001 < FVar52) {
        a_00.super_Tuple3<pbrt::Vector3,_float>.z = a.super_Tuple3<pbrt::Vector3,_float>.z;
        a_00.super_Tuple3<pbrt::Vector3,_float>.x =
             (float)(int)a.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        a_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)a.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
        b_00.super_Tuple3<pbrt::Vector3,_float>.z = local_1d8;
        b_00.super_Tuple3<pbrt::Vector3,_float>.x =
             (float)(int)b.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        b_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)b.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
        c_00.super_Tuple3<pbrt::Vector3,_float>.z = c.super_Tuple3<pbrt::Vector3,_float>.z;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
        c_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.z = d.super_Tuple3<pbrt::Vector3,_float>.z;
        d_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1e8._0_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
        local_1f8 = auVar35;
        local_1e8 = auVar42;
        FVar52 = SphericalQuadArea(a_00,b_00,c_00,d_00);
        fVar53 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        fVar75 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
        auVar35 = vucomiss_avx512f(ZEXT816(0) << 0x40);
        if ((((bVar33) && (!bVar29)) && (fVar75 == 0.0)) && ((fVar53 == 0.0 && (!NAN(fVar53))))) {
          return 1.0 / FVar52;
        }
        pPVar1 = pPVar20 + iVar18;
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar63._4_4_ = fVar53;
        auVar63._0_4_ = fVar53;
        auVar63._8_4_ = fVar53;
        auVar63._12_4_ = fVar53;
        auVar59._4_4_ = fVar75;
        auVar59._0_4_ = fVar75;
        auVar59._8_4_ = fVar75;
        auVar59._12_4_ = fVar75;
        auVar37 = vbroadcastss_avx512vl(auVar35);
        s = &(pPVar20->super_Tuple3<pbrt::Point3,_float>).x + local_1c0;
        pfVar2 = &(pPVar20->super_Tuple3<pbrt::Point3,_float>).x + local_1c8;
        pPVar20 = pPVar20 + iVar17;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = s;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = pfVar2;
        auVar35 = vpunpcklqdq_avx(auVar70,auVar67);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = pPVar20;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = pPVar1;
        auVar42 = vpunpcklqdq_avx(auVar73,auVar71);
        auVar69._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar42;
        auVar69._16_16_ = ZEXT116(1) * auVar35;
        auVar44._8_4_ = 8;
        auVar44._0_8_ = 8;
        auVar44._12_4_ = 0;
        auVar44._16_8_ = 8;
        auVar44._24_8_ = 8;
        auVar44 = vpaddq_avx512vl(auVar69,auVar44);
        auVar15._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar15._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar15._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar15._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        uVar9 = *(undefined8 *)
                 &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x.high;
        auVar35 = vinsertps_avx(auVar15,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        auVar72._0_4_ = (float)uVar9 + auVar35._0_4_;
        auVar72._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar35._4_4_;
        auVar72._8_4_ = auVar35._8_4_ + 0.0;
        auVar72._12_4_ = auVar35._12_4_ + 0.0;
        auVar51 = auVar44._16_16_;
        auVar35 = vmulps_avx512vl(auVar72,auVar36);
        local_178._0_8_ = vmovlps_avx(auVar35);
        local_178.z = ((ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        uVar7 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
        uVar13 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
        auVar81._4_4_ = uVar13;
        auVar81._0_4_ = uVar7;
        auVar81._8_8_ = 0;
        uVar8 = (pPVar20->super_Tuple3<pbrt::Point3,_float>).x;
        uVar14 = (pPVar20->super_Tuple3<pbrt::Point3,_float>).y;
        auVar85._4_4_ = uVar14;
        auVar85._0_4_ = uVar8;
        auVar85._8_8_ = 0;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)s;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)pfVar2;
        auVar42 = vsubps_avx(auVar81,auVar35);
        auVar38 = vsubps_avx512vl(auVar85,auVar35);
        auVar64 = vsubps_avx(auVar79,auVar35);
        auVar43 = vsubps_avx(auVar83,auVar35);
        auVar39 = vgatherqps_avx512vl(*(undefined8 *)s);
        auVar74._4_4_ = local_178.z;
        auVar74._0_4_ = local_178.z;
        auVar74._8_4_ = local_178.z;
        auVar74._12_4_ = local_178.z;
        auVar82._0_4_ = auVar42._0_4_ * auVar42._0_4_;
        auVar82._4_4_ = auVar42._4_4_ * auVar42._4_4_;
        auVar82._8_4_ = auVar42._8_4_ * auVar42._8_4_;
        auVar82._12_4_ = auVar42._12_4_ * auVar42._12_4_;
        auVar35 = vmulps_avx512vl(auVar38,auVar38);
        auVar84._0_4_ = auVar43._0_4_ * auVar43._0_4_;
        auVar84._4_4_ = auVar43._4_4_ * auVar43._4_4_;
        auVar84._8_4_ = auVar43._8_4_ * auVar43._8_4_;
        auVar84._12_4_ = auVar43._12_4_ * auVar43._12_4_;
        auVar80._0_4_ = auVar64._0_4_ * auVar64._0_4_;
        auVar80._4_4_ = auVar64._4_4_ * auVar64._4_4_;
        auVar80._8_4_ = auVar64._8_4_ * auVar64._8_4_;
        auVar80._12_4_ = auVar64._12_4_ * auVar64._12_4_;
        auVar40 = vunpcklps_avx512vl(auVar82,auVar35);
        auVar62 = vsubps_avx(auVar39,auVar74);
        auVar41 = vinsertps_avx512f(auVar35,auVar82,0x4c);
        auVar35 = vmovlhps_avx512f(auVar40,auVar84);
        auVar40 = vinsertps_avx512f(auVar35,auVar80,0x30);
        auVar35 = vshufps_avx(auVar80,auVar84,0x55);
        auVar35 = vshufps_avx(auVar41,auVar35,0x24);
        auVar35 = vaddps_avx512vl(auVar40,auVar35);
        auVar76._0_4_ = auVar35._0_4_ + auVar62._0_4_ * auVar62._0_4_;
        auVar76._4_4_ = auVar35._4_4_ + auVar62._4_4_ * auVar62._4_4_;
        auVar76._8_4_ = auVar35._8_4_ + auVar62._8_4_ * auVar62._8_4_;
        auVar76._12_4_ = auVar35._12_4_ + auVar62._12_4_ * auVar62._12_4_;
        auVar35 = vunpcklps_avx512vl(auVar42,auVar38);
        auVar42 = vinsertps_avx512f(auVar38,auVar42,0x4c);
        auVar35 = vmovlhps_avx(auVar35,auVar43);
        auVar41 = vinsertps_avx(auVar35,auVar64,0x30);
        auVar35 = vshufps_avx(auVar64,auVar43,0x55);
        auVar64 = vsqrtps_avx(auVar76);
        auVar42 = vshufps_avx(auVar42,auVar35,0x24);
        auVar35 = vdivps_avx(auVar62,auVar64);
        auVar42 = vdivps_avx(auVar42,auVar64);
        auVar41 = vdivps_avx(auVar41,auVar64);
        auVar77._0_4_ = fVar53 * auVar35._0_4_;
        auVar77._4_4_ = fVar53 * auVar35._4_4_;
        auVar77._8_4_ = fVar53 * auVar35._8_4_;
        auVar77._12_4_ = fVar53 * auVar35._12_4_;
        auVar42 = vfmadd213ps_fma(auVar59,auVar42,auVar77);
        auVar35 = vfmsub213ps_fma(auVar35,auVar63,auVar77);
        auVar60._0_4_ = auVar42._0_4_ + auVar35._0_4_;
        auVar60._4_4_ = auVar42._4_4_ + auVar35._4_4_;
        auVar60._8_4_ = auVar42._8_4_ + auVar35._8_4_;
        auVar60._12_4_ = auVar42._12_4_ + auVar35._12_4_;
        auVar35 = vfmadd213ps_fma(auVar37,auVar41,auVar60);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)s;
        auVar21._8_4_ = 0x7fffffff;
        auVar21._0_8_ = 0x7fffffff7fffffff;
        auVar21._12_4_ = 0x7fffffff;
        auVar41 = vandps_avx512vl(auVar35,auVar21);
        auVar35 = vhsubps_avx(auVar39,auVar39);
        auVar22._8_4_ = 0x3c23d70a;
        auVar22._0_8_ = 0x3c23d70a3c23d70a;
        auVar22._12_4_ = 0x3c23d70a;
        uVar9 = vcmpps_avx512vl(auVar41,auVar22,0xe);
        bVar28 = (byte)uVar9;
        auVar42 = vsubps_avx(auVar83,auVar61);
        local_188._0_8_ = vmovlps_avx(auVar42);
        local_188.z = (float)vextractps_avx(auVar35,3);
        auVar42 = vsubps_avx(auVar85,auVar61);
        auVar35 = vmovshdup_avx(auVar39);
        local_198.z = auVar35._0_4_ - s[2];
        local_198._0_8_ = vmovlps_avx(auVar42);
        auVar25._4_4_ = local_168._4_4_;
        auVar25._0_4_ = local_168._0_4_;
        auVar25._8_4_ = local_168._8_4_;
        auVar25._12_4_ = local_168._12_4_;
        auVar35 = vinsertps_avx(auVar25,ZEXT416((uint)local_168._12_4_),0x10);
        auVar54._0_4_ = (float)local_168._4_4_ + auVar35._0_4_;
        auVar54._4_4_ = (float)local_168._8_4_ + auVar35._4_4_;
        auVar54._8_4_ = auVar35._8_4_ + 0.0;
        auVar54._12_4_ = auVar35._12_4_ + 0.0;
        auVar35 = vmulps_avx512vl(auVar54,auVar36);
        local_1a8._0_8_ = vmovlps_avx(auVar35);
        local_1a8.z = ((float)local_168._16_4_ + (float)local_168._20_4_) * 0.5;
        auVar57._0_8_ =
             InvertSphericalRectangleSample
                       ((Point3f *)&local_178,(Point3f *)s,(Vector3f *)&local_188,
                        (Vector3f *)&local_198,(Point3f *)&local_1a8);
        auVar57._8_56_ = extraout_var;
        fVar75 = 0.0;
        fVar53 = auVar57._0_4_;
        if ((0.0 <= fVar53) && (fVar53 <= 1.0)) {
          auVar35 = vmovshdup_avx(auVar57._0_16_);
          fVar58 = auVar35._0_4_;
          if ((0.0 <= fVar58) && (fVar58 <= 1.0)) {
            auVar35 = vshufps_avx(auVar41,auVar41,0xff);
            auVar42 = vshufps_avx(auVar41,auVar41,0x4e);
            auVar64 = SUB6416(ZEXT464(0x3c23d70a),0);
            auVar46._16_16_ = auVar51;
            auVar46._0_16_ = auVar64;
            auVar45._4_28_ = auVar46._4_28_;
            auVar45._0_4_ =
                 (float)((uint)(bVar28 >> 3 & 1) * auVar35._0_4_ +
                        (uint)!(bool)(bVar28 >> 3 & 1) * 0x3c23d70a);
            fVar34 = (float)((uint)(bVar28 >> 2 & 1) * auVar42._0_4_ +
                            (uint)!(bool)(bVar28 >> 2 & 1) * 0x3c23d70a);
            auVar35 = vshufps_avx(auVar41,auVar41,0xf5);
            auVar48._16_16_ = auVar51;
            auVar48._0_16_ = auVar64;
            auVar47._4_28_ = auVar48._4_28_;
            auVar47._0_4_ =
                 (float)((uint)(bVar28 & 1) * auVar41._0_4_ + (uint)!(bool)(bVar28 & 1) * 0x3c23d70a
                        );
            auVar50._16_16_ = auVar51;
            auVar50._0_16_ = auVar64;
            auVar49._4_28_ = auVar50._4_28_;
            auVar49._0_4_ =
                 (float)((uint)(bVar28 >> 1 & 1) * auVar35._0_4_ +
                        (uint)!(bool)(bVar28 >> 1 & 1) * 0x3c23d70a);
            fVar3 = auVar45._0_4_ + fVar34 + auVar49._0_4_ + auVar47._0_4_;
            fVar75 = 1.0;
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              auVar35 = vfmadd213ss_fma(auVar45._0_16_,
                                        ZEXT416((uint)((1.0 - fVar53) * (1.0 - fVar58))),
                                        ZEXT416((uint)(fVar53 * (1.0 - fVar58) * fVar34)));
              auVar35 = vfmadd213ss_fma(auVar49._0_16_,ZEXT416((uint)((1.0 - fVar53) * fVar58)),
                                        auVar35);
              auVar35 = vfmadd213ss_fma(auVar47._0_16_,ZEXT416((uint)(fVar53 * fVar58)),auVar35);
              fVar75 = (auVar35._0_4_ * 4.0) / fVar3;
            }
          }
        }
        return (1.0 / FVar52) * fVar75;
      }
    }
    FVar52 = PDF(this,(Interaction *)&local_168.__align);
    auVar27._4_4_ = local_168._8_4_;
    auVar27._0_4_ = local_168._4_4_;
    auVar27._8_4_ = local_168._12_4_;
    auVar27._12_4_ = local_168._16_4_;
    auVar26._4_4_ = local_168._4_4_;
    auVar26._0_4_ = local_168._0_4_;
    auVar26._8_4_ = local_168._8_4_;
    auVar26._12_4_ = local_168._12_4_;
    auVar23._8_4_ = 0x80000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar23._12_4_ = 0x80000000;
    auVar42 = vxorps_avx512vl(ZEXT416((uint)local_208.z),auVar23);
    auVar35 = vinsertps_avx(auVar27,ZEXT416((uint)local_168._20_4_),0x10);
    auVar42 = ZEXT416((uint)((float)local_168._48_4_ * auVar42._0_4_));
    auVar41 = vfnmadd132ss_fma(ZEXT416((uint)local_168._44_4_),auVar42,ZEXT416((uint)local_208.y));
    auVar64 = vfnmsub213ss_fma(ZEXT416((uint)local_208.z),ZEXT416((uint)local_168._48_4_),auVar42);
    auVar16._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar16._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar16._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar16._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar42 = vinsertps_avx(auVar16,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                            0x10);
    auVar64 = vfnmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ + auVar64._0_4_)),
                               ZEXT416((uint)local_168._40_4_),ZEXT416((uint)local_208.x));
    auVar41 = vinsertps_avx(*(undefined1 (*) [16])
                             &(ctx->pi).super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                            ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10);
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar43 = vandps_avx512vl(auVar64,auVar24);
    fVar53 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
             ((float)local_168._8_4_ + (float)local_168._12_4_) * 0.5;
    auVar64 = vinsertps_avx(auVar26,ZEXT416((uint)local_168._16_4_),0x10);
    auVar65._0_4_ = (auVar42._0_4_ + auVar41._0_4_) * 0.5;
    auVar65._4_4_ = (auVar42._4_4_ + auVar41._4_4_) * 0.5;
    auVar65._8_4_ = (auVar42._8_4_ + auVar41._8_4_) * 0.5;
    auVar65._12_4_ = (auVar42._12_4_ + auVar41._12_4_) * 0.5;
    auVar68._0_4_ = (auVar64._0_4_ + auVar35._0_4_) * 0.5;
    auVar68._4_4_ = (auVar64._4_4_ + auVar35._4_4_) * 0.5;
    auVar68._8_4_ = (auVar64._8_4_ + auVar35._8_4_) * 0.5;
    auVar68._12_4_ = (auVar64._12_4_ + auVar35._12_4_) * 0.5;
    auVar35 = vsubps_avx(auVar65,auVar68);
    auVar66._0_4_ = auVar35._0_4_ * auVar35._0_4_;
    auVar66._4_4_ = auVar35._4_4_ * auVar35._4_4_;
    auVar66._8_4_ = auVar35._8_4_ * auVar35._8_4_;
    auVar66._12_4_ = auVar35._12_4_ * auVar35._12_4_;
    auVar35 = vmovshdup_avx(auVar66);
    fVar53 = FVar52 / (auVar43._0_4_ / (auVar66._0_4_ + fVar53 * fVar53 + auVar35._0_4_));
    FVar52 = (Float)((uint)(ABS(fVar53) != INFINITY) * (int)fVar53);
  }
  return FVar52;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle(mesh) && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}